

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void allocStatement(void)

{
  int a;
  item *x_00;
  object *y;
  typeDesc *ptVar1;
  item *x;
  typeDesc *type;
  object *obj;
  int r;
  
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol != 0x12d) {
    mark("missing left parantheses");
    exit(-1);
  }
  getSymbol();
  if (currentSymbol == 0x12e) {
    mark("empty alloc");
    exit(-1);
  }
  if (currentSymbol != 0x1f5) {
    mark("missing identifier");
    exit(-1);
  }
  getSymbol();
  y = find();
  makeItem(x_00,y);
  ptVar1 = getType(y->typeIndex);
  if (ptVar1->base->form == 0x323) {
    a = getReg();
    put(0x32,a,0,ptVar1->base->size);
    if (x_00->lev == 0) {
      x_00->a = RISC_MEMSIZE + x_00->a;
    }
    put(0x24,a,x_00->r,x_00->a);
    regs[a] = 0;
    if (currentSymbol == 0x12e) {
      getSymbol();
      semicolon();
      return;
    }
    mark("missing closing right paran");
    exit(-1);
  }
  mark("cannot alloc mem for datatype");
  exit(-1);
}

Assistant:

procedure 
void allocStatement(void) {
	variable int r;
	variable struct object *obj;
	variable struct typeDesc *type;
	variable struct item *x;
	obj = NULL; type = NULL; x = NULL;
	allocMem(x);
	if (currentSymbol == SYMBOL_LPARAN) {
		getSymbol();
		if (currentSymbol == SYMBOL_RPARAN) {
			mark("empty alloc");
			exit(-1);
		} else {
			if (currentSymbol == SYMBOL_IDENTIFIER) {
				getSymbol();
				obj = find();
				makeItem(x,obj);
				type = getType(obj->typeIndex); /* this is the reference type */
				if (type->base->form == FORM_RECORD) {
					r = getReg();
					put(RISC_ALL,r,0,type->base->size);
					if (x->lev == 0) {
						x->a = RISC_MEMSIZE + x->a;
					}
					put(RISC_STW,r,x->r,x->a);
					regs[r] = 0;
				} else {
					mark("cannot alloc mem for datatype");
					exit(-1);
				}
			} else {
				mark("missing identifier");
				exit(-1);
			}
		}
		if (currentSymbol == SYMBOL_RPARAN) {
			getSymbol();
		} else {
			mark("missing closing right paran");
			exit(-1);
		}
		semicolon();
	} else {
		mark("missing left parantheses");
		exit(-1);
	}
}